

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_hash_context_t * create_sha256_context(ptls_context_t *ctx)

{
  ptls_hash_context_t *ppVar1;
  long in_RDI;
  ptls_cipher_suite_t **cs;
  long *local_18;
  
  local_18 = *(long **)(in_RDI + 0x18);
  while( true ) {
    if (*local_18 == 0) {
      return (ptls_hash_context_t *)0x0;
    }
    if ((*(ushort *)*local_18 | 2) == 0x1303) break;
    local_18 = local_18 + 1;
  }
  ppVar1 = (ptls_hash_context_t *)(**(code **)(*(long *)(*local_18 + 0x10) + 0x10))();
  return ppVar1;
}

Assistant:

static ptls_hash_context_t *create_sha256_context(ptls_context_t *ctx)
{
    ptls_cipher_suite_t **cs;

    for (cs = ctx->cipher_suites; *cs != NULL; ++cs) {
        switch ((*cs)->id) {
        case PTLS_CIPHER_SUITE_AES_128_GCM_SHA256:
        case PTLS_CIPHER_SUITE_CHACHA20_POLY1305_SHA256:
            return (*cs)->hash->create();
        }
    }

    return NULL;
}